

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::Gemm_x86_fma::forward_int8
          (Gemm_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  size_type sVar1;
  const_reference pvVar2;
  reference pvVar3;
  Mat *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  bool bVar4;
  int in_stack_00000110;
  int in_stack_00000118;
  int in_stack_00000120;
  int in_stack_00000128;
  int in_stack_00000130;
  int in_stack_00000138;
  int in_stack_00000140;
  int in_stack_00000148;
  Option *in_stack_00000150;
  Mat *B_3;
  Mat *A_3;
  Mat *A_2;
  Mat *B_2;
  int ret;
  int _nT;
  Mat *top_blob;
  size_t out_elemsize;
  int outh;
  int out_elempack;
  int in_stack_000002e0;
  int in_stack_000002e8;
  int in_stack_000002f0;
  int in_stack_000002f8;
  int in_stack_00000300;
  int in_stack_00000308;
  int in_stack_00000310;
  Option *in_stack_00000318;
  int broadcast_type_C;
  Mat C;
  Mat *B_1;
  Mat *A_1;
  Mat *A;
  Mat *B;
  int N;
  int M;
  int in_stack_00000430;
  int in_stack_00000438;
  int in_stack_00000440;
  int in_stack_00000448;
  int in_stack_00000450;
  int in_stack_00000458;
  int in_stack_00000460;
  int in_stack_00000468;
  Option *in_stack_00000470;
  int in_stack_00000630;
  int in_stack_00000638;
  int in_stack_00000640;
  int in_stack_00000648;
  int in_stack_00000650;
  int in_stack_00000658;
  Option *in_stack_00000660;
  undefined4 in_stack_fffffffffffff8d0;
  int in_stack_fffffffffffff8d4;
  undefined4 in_stack_fffffffffffff8d8;
  int in_stack_fffffffffffff8dc;
  undefined4 in_stack_fffffffffffff8e0;
  int in_stack_fffffffffffff8e4;
  int iVar5;
  undefined8 in_stack_fffffffffffff8e8;
  int _w;
  Mat *in_stack_fffffffffffff8f0;
  Allocator *in_stack_fffffffffffff950;
  int local_590;
  int local_58c;
  int local_588;
  float local_584;
  int local_580;
  float local_57c;
  int local_578;
  int local_574;
  int local_544;
  Mat local_520;
  Mat local_4d8;
  Mat local_490;
  Mat local_448;
  undefined4 local_3ec;
  Mat local_3e8;
  const_reference in_stack_fffffffffffffc60;
  float beta;
  const_reference in_stack_fffffffffffffc68;
  const_reference in_stack_fffffffffffffc70;
  const_reference in_stack_fffffffffffffc78;
  int local_380;
  int local_354;
  Mat *in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  Mat *in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  undefined8 in_stack_fffffffffffffdb0;
  float B_int8_scale;
  Mat *in_stack_fffffffffffffdb8;
  Mat *in_stack_fffffffffffffdc0;
  float in_stack_fffffffffffffdcc;
  Mat *in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  Mat *in_stack_fffffffffffffde0;
  Mat *in_stack_fffffffffffffde8;
  Mat *in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  Mat *in_stack_ffffffffffffff28;
  Mat *in_stack_ffffffffffffff30;
  Mat *in_stack_ffffffffffffff38;
  Mat *in_stack_ffffffffffffff40;
  Mat *in_stack_ffffffffffffff48;
  Mat *in_stack_ffffffffffffff50;
  
  beta = (float)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  B_int8_scale = (float)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
  if ((*(int *)(in_RDI + 0xe0) == 0) || (*(int *)(in_RDI + 0xe4) == 0)) {
    if (*(int *)(in_RDI + 0xe0) == 0) {
      if (*(int *)(in_RDI + 0xe4) == 0) {
        in_stack_fffffffffffffc68 =
             std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                       ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RSI,0);
        in_stack_fffffffffffffc60 =
             std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                       ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RSI,1);
        if (*(int *)(in_RDI + 0xd8) == 0) {
          if (in_stack_fffffffffffffc68->dims == 3) {
            local_588 = in_stack_fffffffffffffc68->c;
          }
          else {
            local_588 = in_stack_fffffffffffffc68->h;
          }
          local_584 = (float)(local_588 * in_stack_fffffffffffffc68->elempack);
        }
        else {
          local_584 = (float)in_stack_fffffffffffffc68->w;
        }
        if (*(int *)(in_RDI + 0xdc) == 0) {
          local_590 = in_stack_fffffffffffffc60->w;
        }
        else {
          if (in_stack_fffffffffffffc60->dims == 3) {
            local_58c = in_stack_fffffffffffffc60->c;
          }
          else {
            local_58c = in_stack_fffffffffffffc60->h;
          }
          local_590 = local_58c * in_stack_fffffffffffffc60->elempack;
        }
        local_380 = local_590;
        local_57c = local_584;
      }
      else {
        in_stack_fffffffffffffc70 =
             std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                       ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RSI,0);
        if (*(int *)(in_RDI + 0xd8) == 0) {
          if (in_stack_fffffffffffffc70->dims == 3) {
            local_580 = in_stack_fffffffffffffc70->c;
          }
          else {
            local_580 = in_stack_fffffffffffffc70->h;
          }
          local_57c = (float)(local_580 * in_stack_fffffffffffffc70->elempack);
        }
        else {
          local_57c = (float)in_stack_fffffffffffffc70->w;
        }
        local_380 = *(int *)(in_RDI + 0xf0);
      }
      beta = (float)((ulong)in_stack_fffffffffffffc60 >> 0x20);
    }
    else {
      in_stack_fffffffffffffc78 =
           std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                     ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RSI,0);
      local_57c = *(float *)(in_RDI + 0xec);
      if (*(int *)(in_RDI + 0xdc) == 0) {
        local_578 = in_stack_fffffffffffffc78->w;
      }
      else {
        if (in_stack_fffffffffffffc78->dims == 3) {
          local_574 = in_stack_fffffffffffffc78->c;
        }
        else {
          local_574 = in_stack_fffffffffffffc78->h;
        }
        local_578 = local_574 * in_stack_fffffffffffffc78->elempack;
      }
      local_380 = local_578;
    }
  }
  else {
    local_57c = *(float *)(in_RDI + 0xec);
    local_380 = *(int *)(in_RDI + 0xf0);
  }
  local_3e8.data = (Mat *)0x0;
  local_3e8.refcount = (int *)0x0;
  local_3e8.elemsize = 0;
  local_3e8.elempack = 0;
  local_3e8.allocator = (Allocator *)0x0;
  local_3e8.dims = 0;
  local_3e8.w = 0;
  local_3e8.h = 0;
  local_3e8.d = 0;
  local_3e8.c = 0;
  local_3e8.cstep = 0;
  local_3ec = 0;
  if (*(int *)(in_RDI + 0xe8) == 0) {
    if ((*(int *)(in_RDI + 0xe0) == 0) || (*(int *)(in_RDI + 0xe4) == 0)) {
      if (*(int *)(in_RDI + 0xe0) == 0) {
        if (*(int *)(in_RDI + 0xe4) == 0) {
          sVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size
                            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RSI);
          if (sVar1 == 3) {
            pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RSI,2);
            local_520.data = pvVar2->data;
            local_520.refcount = pvVar2->refcount;
            local_520.elemsize = pvVar2->elemsize;
            local_520.elempack = pvVar2->elempack;
            local_520.allocator = pvVar2->allocator;
            local_520.dims = pvVar2->dims;
            local_520.w = pvVar2->w;
            local_520.h = pvVar2->h;
            local_520.d = pvVar2->d;
            local_520.c = pvVar2->c;
            local_520.cstep = pvVar2->cstep;
            if (local_520.refcount != (int *)0x0) {
              LOCK();
              *local_520.refcount = *local_520.refcount + 1;
              UNLOCK();
            }
          }
          else {
            local_520.data = (void *)0x0;
            local_520.refcount = (int *)0x0;
            local_520.elemsize = 0;
            local_520.elempack = 0;
            local_520.allocator = (Allocator *)0x0;
            local_520.dims = 0;
            local_520.w = 0;
            local_520.h = 0;
            local_520.d = 0;
            local_520.c = 0;
            local_520.cstep = 0;
          }
          in_stack_fffffffffffffdf0 = &local_3e8;
          in_stack_fffffffffffffde0 = &local_520;
          in_stack_fffffffffffffde8 = in_stack_fffffffffffffdf0;
          if (in_stack_fffffffffffffdf0 != in_stack_fffffffffffffde0) {
            if (local_520.refcount != (int *)0x0) {
              in_stack_fffffffffffffddc = 1;
              LOCK();
              in_stack_fffffffffffffdd8 = *local_520.refcount;
              *local_520.refcount = *local_520.refcount + 1;
              UNLOCK();
            }
            if (local_3e8.refcount != (int *)0x0) {
              in_stack_fffffffffffffdfc = 0xffffffff;
              LOCK();
              in_stack_fffffffffffffdf8 = *local_3e8.refcount;
              *local_3e8.refcount = *local_3e8.refcount + -1;
              UNLOCK();
              if (in_stack_fffffffffffffdf8 == 1) {
                if (local_3e8.allocator == (Allocator *)0x0) {
                  in_stack_ffffffffffffff38 = (Mat *)local_3e8.data;
                  if ((Mat *)local_3e8.data != (Mat *)0x0) {
                    free(local_3e8.data);
                    in_stack_ffffffffffffff38 = (Mat *)local_3e8.data;
                  }
                }
                else {
                  (*(local_3e8.allocator)->_vptr_Allocator[3])(local_3e8.allocator,local_3e8.data);
                }
              }
            }
            local_3e8.data = (void *)0x0;
            local_3e8.elemsize = 0;
            local_3e8.d = 0;
            local_3e8.c = 0;
            local_3e8.cstep = 0;
            local_3e8.refcount = (int *)0x0;
            local_3e8.data = (Mat *)in_stack_fffffffffffffde0->data;
            local_3e8.refcount = in_stack_fffffffffffffde0->refcount;
            local_3e8.elemsize = in_stack_fffffffffffffde0->elemsize;
            local_3e8.elempack = in_stack_fffffffffffffde0->elempack;
            local_3e8.allocator = in_stack_fffffffffffffde0->allocator;
            local_3e8.dims = in_stack_fffffffffffffde0->dims;
            local_3e8.w = in_stack_fffffffffffffde0->w;
            local_3e8.h = in_stack_fffffffffffffde0->h;
            local_3e8.d = in_stack_fffffffffffffde0->d;
            local_3e8.c = in_stack_fffffffffffffde0->c;
            local_3e8.cstep = in_stack_fffffffffffffde0->cstep;
          }
          if (local_520.refcount != (int *)0x0) {
            LOCK();
            iVar5 = *local_520.refcount;
            *local_520.refcount = *local_520.refcount + -1;
            UNLOCK();
            if (iVar5 == 1) {
              if (local_520.allocator == (Allocator *)0x0) {
                if (local_520.data != (void *)0x0) {
                  free(local_520.data);
                }
              }
              else {
                (*(local_520.allocator)->_vptr_Allocator[3])(local_520.allocator,local_520.data);
              }
            }
          }
          local_520.data = (void *)0x0;
          local_520.elemsize = 0;
          local_520.elempack = 0;
          local_520.dims = 0;
          local_520.w = 0;
          local_520.h = 0;
          local_520.d = 0;
          local_520.c = 0;
          local_520.cstep = 0;
          local_520.refcount = (int *)0x0;
        }
        else {
          sVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size
                            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RSI);
          if (sVar1 == 2) {
            pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RSI,1);
            local_4d8.data = pvVar2->data;
            local_4d8.refcount = pvVar2->refcount;
            local_4d8.elemsize = pvVar2->elemsize;
            local_4d8.elempack = pvVar2->elempack;
            local_4d8.allocator = pvVar2->allocator;
            local_4d8.dims = pvVar2->dims;
            local_4d8.w = pvVar2->w;
            local_4d8.h = pvVar2->h;
            local_4d8.d = pvVar2->d;
            local_4d8.c = pvVar2->c;
            local_4d8.cstep = pvVar2->cstep;
            if (local_4d8.refcount != (int *)0x0) {
              LOCK();
              *local_4d8.refcount = *local_4d8.refcount + 1;
              UNLOCK();
            }
          }
          else {
            local_4d8.data = (Mat *)0x0;
            local_4d8.refcount = (int *)0x0;
            local_4d8.elemsize = 0;
            local_4d8.elempack = 0;
            local_4d8.allocator = (Allocator *)0x0;
            local_4d8.dims = 0;
            local_4d8.w = 0;
            local_4d8.h = 0;
            local_4d8.d = 0;
            local_4d8.c = 0;
            local_4d8.cstep = 0;
          }
          if (&local_3e8 != &local_4d8) {
            if (local_4d8.refcount != (int *)0x0) {
              LOCK();
              *local_4d8.refcount = *local_4d8.refcount + 1;
              UNLOCK();
            }
            if (local_3e8.refcount != (int *)0x0) {
              LOCK();
              iVar5 = *local_3e8.refcount;
              *local_3e8.refcount = *local_3e8.refcount + -1;
              UNLOCK();
              if (iVar5 == 1) {
                if (local_3e8.allocator == (Allocator *)0x0) {
                  in_stack_ffffffffffffff30 = (Mat *)local_3e8.data;
                  if ((Mat *)local_3e8.data != (Mat *)0x0) {
                    free(local_3e8.data);
                    in_stack_ffffffffffffff30 = (Mat *)local_3e8.data;
                  }
                }
                else {
                  (*(local_3e8.allocator)->_vptr_Allocator[3])(local_3e8.allocator,local_3e8.data);
                }
              }
            }
            local_3e8.data = local_4d8.data;
            local_3e8.refcount = local_4d8.refcount;
            local_3e8.elemsize = local_4d8.elemsize;
            local_3e8.elempack = local_4d8.elempack;
            local_3e8.allocator = local_4d8.allocator;
            local_3e8.dims = local_4d8.dims;
            local_3e8.w = local_4d8.w;
            local_3e8.h = local_4d8.h;
            local_3e8.d = local_4d8.d;
            local_3e8.c = local_4d8.c;
            local_3e8.cstep = local_4d8.cstep;
          }
          in_stack_fffffffffffffd90 = &local_4d8;
          if (local_4d8.refcount != (int *)0x0) {
            LOCK();
            iVar5 = *local_4d8.refcount;
            *local_4d8.refcount = *local_4d8.refcount + -1;
            UNLOCK();
            if (iVar5 == 1) {
              if (local_4d8.allocator == (Allocator *)0x0) {
                if ((Mat *)local_4d8.data != (Mat *)0x0) {
                  free(local_4d8.data);
                }
              }
              else {
                (*(local_4d8.allocator)->_vptr_Allocator[3])(local_4d8.allocator,local_4d8.data);
              }
            }
          }
          local_4d8.data = (void *)0x0;
          local_4d8.elemsize = 0;
          local_4d8.elempack = 0;
          local_4d8.dims = 0;
          local_4d8.w = 0;
          local_4d8.h = 0;
          local_4d8.d = 0;
          local_4d8.c = 0;
          local_4d8.cstep = 0;
          local_4d8.refcount = (int *)0x0;
        }
      }
      else {
        sVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RSI);
        if (sVar1 == 2) {
          pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RSI,1);
          local_490.data = pvVar2->data;
          local_490.refcount = pvVar2->refcount;
          local_490.elemsize = pvVar2->elemsize;
          local_490.elempack = pvVar2->elempack;
          local_490.allocator = pvVar2->allocator;
          local_490.dims = pvVar2->dims;
          local_490.w = pvVar2->w;
          local_490.h = pvVar2->h;
          local_490.d = pvVar2->d;
          local_490.c = pvVar2->c;
          local_490.cstep = pvVar2->cstep;
          if (local_490.refcount != (int *)0x0) {
            LOCK();
            *local_490.refcount = *local_490.refcount + 1;
            UNLOCK();
          }
        }
        else {
          local_490.data = (Mat *)0x0;
          local_490.refcount = (int *)0x0;
          local_490.elemsize = 0;
          local_490.elempack = 0;
          local_490.allocator = (Allocator *)0x0;
          local_490.dims = 0;
          local_490.w = 0;
          local_490.h = 0;
          local_490.d = 0;
          local_490.c = 0;
          local_490.cstep = 0;
        }
        if (&local_3e8 != &local_490) {
          if (local_490.refcount != (int *)0x0) {
            LOCK();
            *local_490.refcount = *local_490.refcount + 1;
            UNLOCK();
          }
          if (local_3e8.refcount != (int *)0x0) {
            LOCK();
            iVar5 = *local_3e8.refcount;
            *local_3e8.refcount = *local_3e8.refcount + -1;
            UNLOCK();
            if (iVar5 == 1) {
              if (local_3e8.allocator == (Allocator *)0x0) {
                in_stack_ffffffffffffff28 = (Mat *)local_3e8.data;
                if ((Mat *)local_3e8.data != (Mat *)0x0) {
                  free(local_3e8.data);
                  in_stack_ffffffffffffff28 = (Mat *)local_3e8.data;
                }
              }
              else {
                (*(local_3e8.allocator)->_vptr_Allocator[3])(local_3e8.allocator,local_3e8.data);
              }
            }
          }
          local_3e8.data = local_490.data;
          local_3e8.refcount = local_490.refcount;
          local_3e8.elemsize = local_490.elemsize;
          local_3e8.elempack = local_490.elempack;
          local_3e8.allocator = local_490.allocator;
          local_3e8.dims = local_490.dims;
          local_3e8.w = local_490.w;
          local_3e8.h = local_490.h;
          local_3e8.d = local_490.d;
          local_3e8.c = local_490.c;
          local_3e8.cstep = local_490.cstep;
        }
        B_int8_scale = (float)((ulong)&local_490 >> 0x20);
        if (local_490.refcount != (int *)0x0) {
          in_stack_fffffffffffffdac = 0xffffffff;
          LOCK();
          in_stack_fffffffffffffda8 = *local_490.refcount;
          *local_490.refcount = *local_490.refcount + -1;
          UNLOCK();
          if (in_stack_fffffffffffffda8 == 1) {
            if (local_490.allocator == (Allocator *)0x0) {
              in_stack_ffffffffffffff50 = (Mat *)local_490.data;
              if ((Mat *)local_490.data != (Mat *)0x0) {
                free(local_490.data);
                in_stack_ffffffffffffff50 = (Mat *)local_490.data;
              }
            }
            else {
              (*(local_490.allocator)->_vptr_Allocator[3])(local_490.allocator,local_490.data);
            }
          }
        }
        local_490.data = (void *)0x0;
        local_490.elemsize = 0;
        local_490.elempack = 0;
        local_490.dims = 0;
        local_490.w = 0;
        local_490.h = 0;
        local_490.d = 0;
        local_490.c = 0;
        local_490.cstep = 0;
        local_490.refcount = (int *)0x0;
      }
    }
    else {
      sVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RSI);
      if (sVar1 == 1) {
        pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                           ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RSI,0);
        local_448.data = pvVar2->data;
        local_448.refcount = pvVar2->refcount;
        local_448.elemsize = pvVar2->elemsize;
        local_448.elempack = pvVar2->elempack;
        local_448.allocator = pvVar2->allocator;
        local_448.dims = pvVar2->dims;
        local_448.w = pvVar2->w;
        local_448.h = pvVar2->h;
        local_448.d = pvVar2->d;
        local_448.c = pvVar2->c;
        local_448.cstep = pvVar2->cstep;
        if (local_448.refcount != (int *)0x0) {
          LOCK();
          *local_448.refcount = *local_448.refcount + 1;
          UNLOCK();
        }
      }
      else {
        local_448.data = (Mat *)0x0;
        local_448.refcount = (int *)0x0;
        local_448.elemsize = 0;
        local_448.elempack = 0;
        local_448.allocator = (Allocator *)0x0;
        local_448.dims = 0;
        local_448.w = 0;
        local_448.h = 0;
        local_448.d = 0;
        local_448.c = 0;
        local_448.cstep = 0;
      }
      if (&local_3e8 != &local_448) {
        if (local_448.refcount != (int *)0x0) {
          LOCK();
          *local_448.refcount = *local_448.refcount + 1;
          UNLOCK();
        }
        if (local_3e8.refcount != (int *)0x0) {
          LOCK();
          iVar5 = *local_3e8.refcount;
          *local_3e8.refcount = *local_3e8.refcount + -1;
          UNLOCK();
          if (iVar5 == 1) {
            if (local_3e8.allocator == (Allocator *)0x0) {
              if ((Mat *)local_3e8.data != (Mat *)0x0) {
                free(local_3e8.data);
              }
            }
            else {
              (*(local_3e8.allocator)->_vptr_Allocator[3])(local_3e8.allocator,local_3e8.data);
            }
          }
        }
        local_3e8.data = local_448.data;
        local_3e8.refcount = local_448.refcount;
        local_3e8.elemsize = local_448.elemsize;
        local_3e8.elempack = local_448.elempack;
        local_3e8.allocator = local_448.allocator;
        local_3e8.dims = local_448.dims;
        local_3e8.w = local_448.w;
        local_3e8.h = local_448.h;
        local_3e8.d = local_448.d;
        local_3e8.c = local_448.c;
        local_3e8.cstep = local_448.cstep;
      }
      in_stack_fffffffffffffdd0 = &local_448;
      if (local_448.refcount != (int *)0x0) {
        in_stack_fffffffffffffdcc = -NAN;
        LOCK();
        iVar5 = *local_448.refcount;
        *local_448.refcount = *local_448.refcount + -1;
        UNLOCK();
        if (iVar5 == 1) {
          if (local_448.allocator == (Allocator *)0x0) {
            in_stack_ffffffffffffff40 = (Mat *)local_448.data;
            if ((Mat *)local_448.data != (Mat *)0x0) {
              free(local_448.data);
              in_stack_ffffffffffffff40 = (Mat *)local_448.data;
            }
          }
          else {
            (*(local_448.allocator)->_vptr_Allocator[3])(local_448.allocator,local_448.data);
          }
        }
      }
      local_448.data = (void *)0x0;
      local_448.elemsize = 0;
      local_448.elempack = 0;
      local_448.dims = 0;
      local_448.w = 0;
      local_448.h = 0;
      local_448.d = 0;
      local_448.c = 0;
      local_448.cstep = 0;
      local_448.refcount = (int *)0x0;
    }
    if ((Mat *)local_3e8.data != (Mat *)0x0 && local_3e8.cstep * (long)local_3e8.c != 0) {
      if ((local_3e8.dims == 1) && (local_3e8.w == 1)) {
        local_3ec = 0;
      }
      if ((local_3e8.dims == 1) && ((float)(local_3e8.w * local_3e8.elempack) == local_57c)) {
        local_3ec = 1;
      }
      if ((local_3e8.dims == 1) && (local_3e8.w * local_3e8.elempack == local_380)) {
        local_3ec = 4;
      }
      if (((local_3e8.dims == 2) && (local_3e8.w == 1)) &&
         ((float)(local_3e8.h * local_3e8.elempack) == local_57c)) {
        local_3ec = 2;
      }
      if (((local_3e8.dims == 2) && (local_3e8.w == local_380)) &&
         ((float)(local_3e8.h * local_3e8.elempack) == local_57c)) {
        local_3ec = 3;
      }
      if (((local_3e8.dims == 2) && (local_3e8.w == local_380)) &&
         (local_3e8.h * local_3e8.elempack == 1)) {
        local_3ec = 4;
      }
    }
  }
  else {
    if (&local_3e8 != (Mat *)(in_RDI + 0x2d8)) {
      if (*(long *)(in_RDI + 0x2e0) != 0) {
        LOCK();
        **(int **)(in_RDI + 0x2e0) = **(int **)(in_RDI + 0x2e0) + 1;
        UNLOCK();
      }
      local_3e8.data = ((Mat *)(in_RDI + 0x2d8))->data;
      local_3e8.refcount = *(int **)(in_RDI + 0x2e0);
      local_3e8.elemsize = *(size_t *)(in_RDI + 0x2e8);
      local_3e8.allocator = *(Allocator **)(in_RDI + 0x2f8);
      local_3e8.d = *(int *)(in_RDI + 0x30c);
      local_3e8.c = *(int *)(in_RDI + 0x310);
      local_3e8.cstep = *(size_t *)(in_RDI + 0x318);
    }
    local_3ec = *(undefined4 *)(in_RDI + 0xf8);
  }
  pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                     ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RDX,0);
  iVar5 = (int)in_stack_fffffffffffff8e8;
  _w = (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20);
  if (*(int *)(in_RDI + 0x108) == 0) {
    if (*(int *)(in_RDI + 0xfc) == 0) {
      Mat::create(in_stack_fffffffffffff8f0,_w,iVar5,
                  CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                  in_stack_fffffffffffff8dc,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    }
    else {
      Mat::create(in_stack_fffffffffffff8f0,_w,iVar5,in_stack_fffffffffffff8e4,
                  CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                  in_stack_fffffffffffff8d4,in_stack_fffffffffffff950);
    }
  }
  else if (*(int *)(in_RDI + 0xfc) == 0) {
    Mat::create(in_stack_fffffffffffff8f0,_w,iVar5,
                CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                in_stack_fffffffffffff8dc,
                (Allocator *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
  }
  else {
    Mat::create(in_stack_fffffffffffff8f0,_w,iVar5,in_stack_fffffffffffff8e4,
                CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                in_stack_fffffffffffff8d4,in_stack_fffffffffffff950);
  }
  bVar4 = true;
  if (pvVar3->data != (void *)0x0) {
    bVar4 = pvVar3->cstep * (long)pvVar3->c == 0;
  }
  if (bVar4) {
    local_354 = -100;
  }
  else {
    if ((*(int *)(in_RDI + 0x244) != 0) &&
       (*(int *)((long)&in_RCX->data + 4) != *(int *)(in_RDI + 0x244))) {
      fprintf(_stderr,"opt.num_threads %d changed, gemm will use load-time value %d",
              (ulong)*(uint *)((long)&in_RCX->data + 4),(ulong)*(uint *)(in_RDI + 0x244));
      fprintf(_stderr,"\n");
    }
    if ((*(int *)(in_RDI + 0xe0) == 0) || (*(int *)(in_RDI + 0xe4) == 0)) {
      if (*(int *)(in_RDI + 0xe0) == 0) {
        if (*(int *)(in_RDI + 0xe4) == 0) {
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                    ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RSI,0);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                    ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RSI,1);
          local_544 = gemm_x86_int8(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                                    in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                                    (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                                    (int)in_stack_ffffffffffffff30,in_stack_00000630,
                                    in_stack_00000638,
                                    (float)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                                    SUB84(in_stack_ffffffffffffff28,0),in_stack_00000640,
                                    in_stack_00000648,in_stack_00000650,in_stack_00000658,
                                    in_stack_00000660);
        }
        else {
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                    ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RSI,0);
          local_544 = gemm_BT_x86_int8(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                                       B_int8_scale,
                                       (Mat *)CONCAT44(in_stack_fffffffffffffdac,
                                                       in_stack_fffffffffffffda8),
                                       in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                                       in_stack_fffffffffffffd98,in_stack_000002e0,in_stack_000002e8
                                       ,in_stack_000002f0,
                                       (float)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                                       SUB84(in_stack_fffffffffffffd90,0),in_stack_000002f8,
                                       in_stack_00000300,in_stack_00000308,in_stack_00000310,
                                       in_stack_00000318);
        }
      }
      else {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RSI,0);
        local_544 = gemm_AT_x86_int8((Mat *)CONCAT44(in_stack_fffffffffffffdfc,
                                                     in_stack_fffffffffffffdf8),
                                     in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                                     in_stack_fffffffffffffde0,
                                     (Mat *)CONCAT44(in_stack_fffffffffffffddc,
                                                     in_stack_fffffffffffffdd8),
                                     (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                                     in_stack_00000430,in_stack_00000438,in_stack_00000440,
                                     in_stack_00000448,SUB84(in_stack_fffffffffffffdd0,0),
                                     in_stack_fffffffffffffdcc,in_stack_00000450,in_stack_00000458,
                                     in_stack_00000460,in_stack_00000468,in_stack_00000470);
      }
    }
    else {
      local_544 = gemm_AT_BT_x86_int8(in_RSI,in_RDX,in_RCX,local_57c,in_stack_fffffffffffffc78,
                                      in_stack_fffffffffffffc70,
                                      (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),
                                      in_stack_00000110,in_stack_00000118,in_stack_00000120,
                                      in_stack_00000128,SUB84(in_stack_fffffffffffffc68,0),beta,
                                      in_stack_00000130,in_stack_00000138,in_stack_00000140,
                                      in_stack_00000148,in_stack_00000150);
    }
    local_354 = local_544;
  }
  if (local_3e8.refcount != (int *)0x0) {
    LOCK();
    iVar5 = *local_3e8.refcount;
    *local_3e8.refcount = *local_3e8.refcount + -1;
    UNLOCK();
    if (iVar5 == 1) {
      if (local_3e8.allocator == (Allocator *)0x0) {
        if ((Mat *)local_3e8.data != (Mat *)0x0) {
          free(local_3e8.data);
        }
      }
      else {
        (*(local_3e8.allocator)->_vptr_Allocator[3])(local_3e8.allocator,local_3e8.data);
      }
    }
  }
  return local_354;
}

Assistant:

int Gemm_x86_fma::forward_int8(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // FIXME use output_elempack
    // int output_elempack = out_elempack > 4 ? 4 : out_elempack;

    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    // FIXME use output_elemtype instead of input_elemtype
    // int output_elemtype = input_elemtype;

    // TODO use output_elemtype

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86_int8(AT_data, A_data_int8_scales, BT_data, B_data_int8_scale, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86_int8(AT_data, A_data_int8_scales, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86_int8(A, BT_data, B_data_int8_scale, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86_int8(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }

    return ret;
}